

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeContainer.hpp
# Opt level: O2

ElemPtr __thiscall
OpenMD::TypeContainer<OpenMD::BondType,_2>::find
          (TypeContainer<OpenMD::BondType,_2> *this,KeyType *keys,string *wildCard)

{
  MapType *this_00;
  bool bVar1;
  iterator iVar2;
  __normal_iterator<std::pair<int,_OpenMD::BondType_*>_*,_std::vector<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>_>
  _Var3;
  _Rb_tree_header *p_Var4;
  BondType *pBVar5;
  allocator_type local_b9;
  vector<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
  foundTypes;
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  iterCont;
  KeyType reversedKeys;
  KeyType replacedKey;
  KeyType allWildCards;
  
  iterCont.
  super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  iterCont.
  super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iterCont.
  super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  replacedKey.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  foundTypes.
  super__Vector_base<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  replacedKey.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  replacedKey.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  foundTypes.
  super__Vector_base<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  foundTypes.
  super__Vector_base<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->data_;
  p_Var4 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    bVar1 = replaceWithWildCard(&iterCont,keys,&replacedKey,wildCard);
    if (!bVar1) break;
    iVar2 = std::
            _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>_>_>
            ::find(&this_00->_M_t,&replacedKey);
    if ((_Rb_tree_header *)iVar2._M_node != p_Var4) {
      std::
      vector<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
      ::push_back(&foundTypes,(value_type *)&iVar2._M_node[1]._M_right);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&reversedKeys,keys);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (reversedKeys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             reversedKeys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  bVar1 = std::operator!=(&reversedKeys,keys);
  if (bVar1) {
    if (iterCont.
        super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        iterCont.
        super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iterCont.
      super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           iterCont.
           super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    while( true ) {
      bVar1 = replaceWithWildCard(&iterCont,&reversedKeys,&replacedKey,wildCard);
      if (!bVar1) break;
      iVar2 = std::
              _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>_>_>
              ::find(&this_00->_M_t,&replacedKey);
      if ((_Rb_tree_header *)iVar2._M_node != p_Var4) {
        std::
        vector<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
        ::push_back(&foundTypes,(value_type *)&iVar2._M_node[1]._M_right);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&allWildCards,2,wildCard,&local_b9);
    iVar2 = std::
            _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BondType_*>_>_>_>
            ::find(&this_00->_M_t,&allWildCards);
    if ((_Rb_tree_header *)iVar2._M_node != p_Var4) {
      std::
      vector<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
      ::push_back(&foundTypes,(value_type *)&iVar2._M_node[1]._M_right);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&allWildCards);
  }
  _Var3 = std::
          __min_element<__gnu_cxx::__normal_iterator<std::pair<int,OpenMD::BondType*>*,std::vector<std::pair<int,OpenMD::BondType*>,std::allocator<std::pair<int,OpenMD::BondType*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (foundTypes.
                     super__Vector_base<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     foundTypes.
                     super__Vector_base<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var3._M_current ==
      foundTypes.
      super__Vector_base<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar5 = (BondType *)0x0;
  }
  else {
    pBVar5 = (_Var3._M_current)->second;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&reversedKeys);
  std::
  _Vector_base<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
  ::~_Vector_base(&foundTypes.
                   super__Vector_base<std::pair<int,_OpenMD::BondType_*>,_std::allocator<std::pair<int,_OpenMD::BondType_*>_>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&replacedKey);
  std::
  _Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Vector_base(&iterCont.
                   super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 );
  return pBVar5;
}

Assistant:

ElemPtr find(KeyType& keys, const std::string& wildCard) {
      assert(keys.size() == SIZE);

      std::vector<KeyTypeIterator> iterCont;
      KeyType replacedKey;
      MapTypeIterator i;
      std::vector<ValueType> foundTypes;

      while (replaceWithWildCard(iterCont, keys, replacedKey, wildCard)) {
        i = data_.find(replacedKey);
        if (i != data_.end()) { foundTypes.push_back(i->second); }
      }

      // reverse the order of keys
      KeyType reversedKeys = keys;
      std::reverse(reversedKeys.begin(), reversedKeys.end());

      // if the reversedKeys is the same as keys, just skip it
      if (reversedKeys != keys) {
        // empty the iterator container
        iterCont.clear();

        while (replaceWithWildCard(iterCont, reversedKeys, replacedKey,
                                   wildCard)) {
          i = data_.find(replacedKey);
          if (i != data_.end()) { foundTypes.push_back(i->second); }
        }

        // replaceWithWildCard can not generate this particular sequence, we
        // have to do it manually
        KeyType allWildCards(SIZE, wildCard);
        i = data_.find(allWildCards);
        if (i != data_.end()) { foundTypes.push_back(i->second); }
      }

      typename std::vector<ValueType>::iterator j;
      j = std::min_element(foundTypes.begin(), foundTypes.end());
      return j == foundTypes.end() ? NULL : j->second;
    }